

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

saucy_graph *
buildSim1Graph(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randVec,Vec_Int_t **iDep,Vec_Int_t **oDep)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  int *pModel;
  int *__ptr;
  ulong uVar7;
  saucy_graph *psVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  
  uVar2 = pNtk->vPos->nSize;
  uVar3 = pNtk->vPis->nSize;
  pModel = generateProperInputVector(pNtk,c,randVec);
  iVar13 = 0;
  if (pModel == (int *)0x0) {
    psVar8 = (saucy_graph *)0x0;
  }
  else {
    __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
    if (0 < (int)uVar2) {
      uVar7 = 0;
      iVar13 = 0;
      do {
        iVar13 = (iVar13 + 1) - (uint)(__ptr[uVar7] == 0);
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    psVar8 = (saucy_graph *)malloc(0x18);
    piVar9 = (int *)malloc((long)(int)(uVar3 + uVar2) * 4 + 4);
    piVar10 = (int *)malloc((long)(int)(iVar13 * uVar3 * 2) << 2);
    psVar8->n = uVar3 + uVar2;
    psVar8->e = iVar13 * uVar3;
    psVar8->adj = piVar9;
    psVar8->edg = piVar10;
    *piVar9 = 0;
    if (0 < (int)uVar2) {
      uVar7 = 0;
      do {
        iVar13 = piVar9[uVar7];
        if (__ptr[uVar7] == 0) {
          piVar9[uVar7 + 1] = iVar13;
        }
        else {
          pVVar5 = oDep[uVar7];
          iVar4 = pVVar5->nSize;
          iVar1 = iVar4 + iVar13;
          piVar9[uVar7 + 1] = iVar1;
          if (0 < iVar4) {
            lVar11 = 0;
            do {
              if (pVVar5->nSize <= lVar11) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              piVar10[iVar13 + lVar11] = pVVar5->pArray[lVar11] + uVar2;
              lVar12 = iVar13 + lVar11;
              lVar11 = lVar11 + 1;
            } while (lVar12 + 1 < (long)iVar1);
          }
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar2);
    }
    if (0 < (int)uVar3) {
      uVar7 = 0;
      do {
        iVar13 = piVar9[(long)(int)uVar2 + uVar7];
        piVar9[(long)(int)uVar2 + uVar7 + 1] = iVar13;
        pVVar5 = iDep[uVar7];
        if (0 < pVVar5->nSize) {
          piVar6 = pVVar5->pArray;
          lVar11 = 0;
          do {
            if (__ptr[piVar6[lVar11]] != 0) {
              lVar12 = (long)iVar13;
              iVar13 = iVar13 + 1;
              piVar10[lVar12] = piVar6[lVar11];
              piVar9[(long)(int)uVar2 + uVar7 + 1] = piVar9[(long)(int)uVar2 + uVar7 + 1] + 1;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < pVVar5->nSize);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar3);
    }
    free(pModel);
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
  }
  return psVar8;
}

Assistant:

static struct saucy_graph *
buildSim1Graph( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randVec, Vec_Int_t ** iDep, Vec_Int_t ** oDep )
{
    int i, j, k;
    struct saucy_graph *g;
    int n, e, *adj, *edg;
    int * vPiValues, * output;
    int numOneOutputs = 0;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins = Abc_NtkPiNum(pNtk);

    vPiValues = generateProperInputVector(pNtk, c, randVec);
    if (vPiValues == NULL) 
        return NULL;

    output = Abc_NtkVerifySimulatePattern(pNtk, vPiValues);

    for (i = 0; i < numouts; i++) {
        if (output[i])
            numOneOutputs++;
    }

    g = ABC_ALLOC(struct saucy_graph, 1);
    n = numouts + numins;
    e = numins * numOneOutputs;
    adj = ints(n+1);
    edg = ints(2*e);        
    g->n = n;
    g->e = e;
    g->adj = adj;
    g->edg = edg;   

    adj[0] = 0;
    for (i = 0; i < numouts; i++) {
        if (output[i]) {
            adj[i+1] = adj[i] + Vec_IntSize(oDep[i]);
            for (j = adj[i], k = 0; j < adj[i+1]; j++, k++)
                edg[j] = Vec_IntEntry(oDep[i], k) + numouts;
        } else {
            adj[i+1] = adj[i];
        }
    }

    for (i = 0; i < numins; i++) {
        adj[i+numouts+1] = adj[i+numouts];
        for (k = 0, j = adj[i+numouts]; k < Vec_IntSize(iDep[i]); k++) {
            if (output[Vec_IntEntry(iDep[i], k)]) {
                edg[j++] = Vec_IntEntry(iDep[i], k);
                adj[i+numouts+1]++;
            }
        }
    }

    /* print graph */
    /*for (i = 0; i < n; i++) {
        printf("%d: ", i);
        for (j = adj[i]; j < adj[i+1]; j++)
            printf("%d ", edg[j]);
        printf("\n");
    }*/

    ABC_FREE( vPiValues );  
    ABC_FREE( output );
    
    return g;   
}